

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpPackedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort *ptr_00;
  uint32_t size;
  uint uVar1;
  FieldEntry *pFVar2;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 out;
  ushort *puVar3;
  Nullable<const_char_*> failure_msg;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ushort uVar7;
  ushort *local_58;
  unsigned_short local_4a;
  TcParseTableBase *local_48;
  LogMessageFatal local_40;
  
  local_58 = (ushort *)ptr;
  pFVar2 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  if ((data.field_0._0_4_ & 7) != 2) {
    pcVar5 = MpRepeatedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar7 = pFVar2->type_card;
  local_48 = table;
  size = ReadSize((char **)&local_58);
  uVar7 = uVar7 & 0x1c0;
  if (uVar7 == 0xc0) {
    out = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          RefAt<google::protobuf::RepeatedField<unsigned_long>>(msg,(ulong)pFVar2->offset);
    puVar3 = (ushort *)
             EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                       (&ctx->super_EpsCopyInputStream,(char *)local_58,size,
                        (RepeatedField<unsigned_long> *)out);
    ctx_00 = extraout_RDX;
  }
  else {
    local_4a = 0x80;
    local_40.super_LogMessage.errno_saver_.saved_errno_._0_2_ = uVar7;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)&local_40,&local_4a,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7e4,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    out = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
          RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)pFVar2->offset);
    puVar3 = (ushort *)
             EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                       (&ctx->super_EpsCopyInputStream,(char *)local_58,size,
                        (RepeatedField<unsigned_int> *)out);
    ctx_00 = extraout_RDX_00;
  }
  if (puVar3 == (ushort *)0x0) {
    ptr_00 = local_58;
    local_58 = puVar3;
    pcVar5 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)out,local_48,hasbits);
    return pcVar5;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar3) {
    if ((ulong)local_48->has_bits_offset != 0) {
      local_58 = puVar3;
      puVar6 = RefAt<unsigned_int>(msg,(ulong)local_48->has_bits_offset);
      *puVar6 = *puVar6 | (uint)hasbits;
    }
    return (char *)puVar3;
  }
  uVar1 = (uint)local_48->fast_idx_mask & (uint)*puVar3;
  if ((uVar1 & 7) == 0) {
    uVar4 = (ulong)(uVar1 & 0xfffffff8);
    local_58 = puVar3;
    pcVar5 = (char *)(**(code **)(&local_48[1].has_bits_offset + uVar4))
                               (msg,puVar3,ctx,
                                (ulong)*puVar3 ^ *(ulong *)(&local_48[1].fast_idx_mask + uVar4 * 2),
                                local_48,hasbits);
    return pcVar5;
  }
  local_58 = puVar3;
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpPackedFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_wiretype = data.tag() & 7;

  // Check for non-packed repeated fallback:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  int size = ReadSize(&ptr);
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}